

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CfgNode.cpp
# Opt level: O3

void __thiscall CfgNode::BlockData::addSignalHandler(BlockData *this,int sigid,CFG *cfg)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  mapped_type *ppCVar3;
  _Base_ptr p_Var4;
  int local_c;
  
  p_Var4 = (this->m_signalHandlers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_c = sigid;
  if (p_Var4 != (_Base_ptr)0x0) {
    p_Var1 = &(this->m_signalHandlers)._M_t._M_impl.super__Rb_tree_header;
    p_Var2 = &p_Var1->_M_header;
    do {
      if (sigid <= (int)p_Var4[1]._M_color) {
        p_Var2 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[(int)p_Var4[1]._M_color < sigid];
    } while (p_Var4 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var2 != p_Var1) && ((int)p_Var2[1]._M_color <= sigid)) {
      if ((p_Var2[1]._M_parent)->_M_parent == (_Base_ptr)cfg->m_addr) {
        return;
      }
      __assert_fail("it->second->addr() == cfg->addr()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cmpcfgs/src/CfgNode.cpp"
                    ,0xa1,"void CfgNode::BlockData::addSignalHandler(int, CFG *)");
    }
  }
  ppCVar3 = std::map<int,_CFG_*,_std::less<int>,_std::allocator<std::pair<const_int,_CFG_*>_>_>::
            operator[](&this->m_signalHandlers,&local_c);
  *ppCVar3 = cfg;
  return;
}

Assistant:

void CfgNode::BlockData::addSignalHandler(int sigid, CFG* cfg) {
	std::map<int, CFG*>::const_iterator it = m_signalHandlers.find(sigid);
	if (it != m_signalHandlers.end()) {
		assert(it->second->addr() == cfg->addr());
	} else {
		m_signalHandlers[sigid] = cfg;
	}
}